

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genrand.c
# Opt level: O1

unsigned_long genrand_int32(void)

{
  long lVar1;
  ulong uVar2;
  
  if (0x26f < mti) {
    if (mti == 0x271) {
      mt[0] = 0x1571;
      lVar1 = 1;
      uVar2 = 0x1571;
      do {
        uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar1);
        mt[lVar1] = uVar2;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x270);
    }
    lVar1 = 0;
    do {
      mt[lVar1] = genrand_int32::mag01[(uint)mt[lVar1 + 1] & 1] ^ mt[lVar1 + 0x18d] ^
                  (ulong)(((uint)mt[lVar1 + 1] & 0x7ffffffe | (uint)mt[lVar1] & 0x80000000) >> 1);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xe3);
    lVar1 = 0;
    do {
      mt[lVar1 + 0xe3] =
           genrand_int32::mag01[(uint)mt[lVar1 + 0xe4] & 1] ^ mt[lVar1] ^
           (ulong)(((uint)mt[lVar1 + 0xe4] & 0x7ffffffe | (uint)mt[lVar1 + 0xe3] & 0x80000000) >> 1)
      ;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x18c);
    mt[0x26f] = genrand_int32::mag01[(uint)mt[0] & 1] ^ mt[0x18c] ^
                (ulong)(((uint)mt[0] & 0x7ffffffe | (uint)mt[0x26f] & 0x80000000) >> 1);
    mti = 0;
  }
  lVar1 = (long)mti;
  mti = mti + 1;
  uVar2 = mt[lVar1] >> 0xb ^ mt[lVar1];
  uVar2 = ((uint)uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = ((uint)uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

unsigned long
genrand_int32(void)
{
    unsigned long y;
    static unsigned long mag01[2] = { 0x0UL, MATRIX_A };
    /* mag01[x] = x * MATRIX_A  for x=0,1 */

    if (mti >= N) {             /* generate N words at one time */
        int kk;

        if (mti == N + 1)       /* if init_genrand() has not been called, */
            init_genrand(5489UL);       /* a default initial seed is used */

        for (kk = 0; kk < N - M; kk++) {
            y = (mt[kk] & UPPER_MASK) | (mt[kk + 1] & LOWER_MASK);
            mt[kk] = mt[kk + M] ^ (y >> 1) ^ mag01[y & 0x1UL];
        }
        for (; kk < N - 1; kk++) {
            y = (mt[kk] & UPPER_MASK) | (mt[kk + 1] & LOWER_MASK);
            mt[kk] = mt[kk + (M - N)] ^ (y >> 1) ^ mag01[y & 0x1UL];
        }
        y = (mt[N - 1] & UPPER_MASK) | (mt[0] & LOWER_MASK);
        mt[N - 1] = mt[M - 1] ^ (y >> 1) ^ mag01[y & 0x1UL];

        mti = 0;
    }

    y = mt[mti++];

    /* Tempering */
    y ^= (y >> 11);
    y ^= (y << 7) & 0x9d2c5680UL;
    y ^= (y << 15) & 0xefc60000UL;
    y ^= (y >> 18);

    return y;
}